

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

uint64_t get_ref_value(gen_ctx_t gen_ctx,MIR_op_t *ref_op)

{
  char *name;
  int iVar1;
  MIR_label_t pMVar2;
  
  if (ref_op->field_0x8 != '\b') {
    __assert_fail("ref_op->mode == MIR_OP_REF",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2f5,"uint64_t get_ref_value(gen_ctx_t, const MIR_op_t *)");
  }
  pMVar2 = (MIR_label_t)(ref_op->u).ref;
  if ((*(MIR_item_type_t *)&pMVar2->ops[0].data == MIR_data_item) &&
     (name = ((anon_union_8_10_166bea1d_for_u *)((long)&pMVar2->ops[0].u + 0x10))->func->name,
     name != (char *)0x0)) {
    iVar1 = _MIR_reserved_ref_name_p(gen_ctx->ctx,name);
    pMVar2 = (ref_op->u).label;
    if (iVar1 != 0) {
      return (uint64_t)
             &(((anon_union_8_10_166bea1d_for_u *)((long)&pMVar2->ops[0].u + 0x10))->func->insns).
              tail;
    }
  }
  return (uint64_t)(void *)pMVar2->ops[0].u.i;
}

Assistant:

static uint64_t get_ref_value (gen_ctx_t gen_ctx, const MIR_op_t *ref_op) {
  gen_assert (ref_op->mode == MIR_OP_REF);
  if (ref_op->u.ref->item_type == MIR_data_item && ref_op->u.ref->u.data->name != NULL
      && _MIR_reserved_ref_name_p (gen_ctx->ctx, ref_op->u.ref->u.data->name))
    return (uint64_t) ref_op->u.ref->u.data->u.els;
  return (uint64_t) ref_op->u.ref->addr;
}